

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong *puVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  Geometry *geometry;
  long lVar32;
  ulong *puVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar41 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar62;
  float fVar63;
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [32];
  float fVar68;
  float fVar74;
  float fVar75;
  vint4 ai_3;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  vint4 ai;
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar79 [32];
  vint4 ai_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 ai_4;
  undefined1 auVar90 [16];
  vint4 ai_6;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [244];
  ulong *local_b88;
  ulong local_b78;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  ulong local_b40;
  ulong local_b38;
  ulong local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong *local_b10;
  ulong local_b08;
  ulong local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  ulong local_ae0;
  ulong local_ad8;
  ulong local_ad0;
  long local_ac8;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  RTCFilterFunctionNArguments local_a40;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [16];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined1 local_990 [16];
  uint local_980;
  uint uStack_97c;
  uint uStack_978;
  uint uStack_974;
  uint uStack_970;
  uint uStack_96c;
  uint uStack_968;
  uint uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  byte local_8df;
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_b10 = local_7f8;
  local_800 = root.ptr;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar102 = ZEXT1664(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar103 = ZEXT1664(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar104 = ZEXT1664(auVar39);
  auVar37 = vmulss_avx512f(auVar37,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40._0_4_ = auVar37._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar37 = vmulss_avx512f(auVar38,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar38._0_4_ = auVar37._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar37 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar39._0_4_ = auVar37._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = uVar26 ^ 0x10;
  uVar30 = uVar27 ^ 0x10;
  uVar34 = uVar28 ^ 0x10;
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  auVar37 = vxorps_avx512vl(auVar40,auVar86);
  auVar105 = ZEXT1664(auVar37);
  auVar37 = vxorps_avx512vl(auVar38,auVar86);
  auVar106 = ZEXT1664(auVar37);
  auVar37 = vxorps_avx512vl(auVar39,auVar86);
  auVar107 = ZEXT1664(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar108 = ZEXT1664(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar109 = ZEXT1664(auVar37);
  local_ae0 = uVar26 >> 2;
  local_ae8 = uVar29 >> 2;
  local_af0 = uVar27 >> 2;
  local_af8 = uVar30 >> 2;
  local_b00 = uVar28 >> 2;
  local_b08 = uVar34 >> 2;
  auVar37 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar110 = ZEXT1664(auVar37);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar111 = ZEXT3264(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar112 = ZEXT3264(auVar42);
  local_a00 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar33 = local_b10;
  local_b40 = uVar34;
  local_b38 = uVar30;
  local_b30 = uVar29;
  local_b28 = uVar28;
  local_b20 = uVar27;
  local_b18 = uVar26;
  do {
    puVar22 = puVar33;
    if (puVar22 == &local_800) break;
    local_b88 = puVar22 + -1;
    uVar24 = puVar22[-1];
    do {
      if ((uVar24 & 8) == 0) {
        auVar37 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar26),auVar105._0_16_,
                             auVar102._0_16_);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar27),auVar106._0_16_,
                             auVar103._0_16_);
        auVar37 = vpmaxsd_avx(auVar37,auVar38);
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar28),auVar107._0_16_,
                             auVar104._0_16_);
        auVar38 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar29),auVar105._0_16_,
                             auVar102._0_16_);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar30),auVar106._0_16_,
                             auVar103._0_16_);
        auVar38 = vpminsd_avx(auVar38,auVar40);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar24 + 0x20 + uVar34),auVar107._0_16_,
                             auVar104._0_16_);
        auVar39 = vpmaxsd_avx512vl(auVar39,auVar108._0_16_);
        auVar37 = vpmaxsd_avx(auVar37,auVar39);
        auVar39 = vpminsd_avx512vl(auVar40,auVar109._0_16_);
        auVar38 = vpminsd_avx(auVar38,auVar39);
        uVar11 = vpcmpd_avx512vl(auVar37,auVar38,2);
        local_b10 = (ulong *)CONCAT44((int)((ulong)local_b10 >> 0x20),(uint)((byte)uVar11 & 0xf));
      }
      if ((uVar24 & 8) == 0) {
        if (local_b10 == (ulong *)0x0) {
          uVar99 = 4;
        }
        else {
          uVar23 = uVar24 & 0xfffffffffffffff0;
          lVar20 = 0;
          for (puVar33 = local_b10; ((ulong)puVar33 & 1) == 0;
              puVar33 = (ulong *)((ulong)puVar33 >> 1 | 0x8000000000000000)) {
            lVar20 = lVar20 + 1;
          }
          uVar99 = 0;
          uVar21 = (long)local_b10 - 1U & (ulong)local_b10;
          uVar24 = *(ulong *)(uVar23 + lVar20 * 8);
          if (uVar21 != 0) {
            *local_b88 = uVar24;
            lVar20 = 0;
            for (uVar24 = uVar21; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar24 = *(ulong *)(uVar23 + lVar20 * 8);
            for (uVar21 = uVar21 - 1 & uVar21; local_b88 = local_b88 + 1, uVar21 != 0;
                uVar21 = uVar21 - 1 & uVar21) {
              *local_b88 = uVar24;
              lVar20 = 0;
              for (uVar24 = uVar21; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar24 = *(ulong *)(uVar23 + lVar20 * 8);
            }
          }
        }
      }
      else {
        uVar99 = 6;
      }
    } while (uVar99 == 0);
    if (uVar99 == 6) {
      local_ad8 = (ulong)((uint)uVar24 & 0xf) - 8;
      bVar35 = local_ad8 != 0;
      if (bVar35) {
        uVar24 = uVar24 & 0xfffffffffffffff0;
        local_ad0 = 0;
        puVar33 = puVar22;
        do {
          lVar20 = local_ad0 * 0x58;
          local_ac8 = uVar24 + lVar20;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(uVar24 + 0x20 + lVar20);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = *(ulong *)(uVar24 + 0x24 + lVar20);
          uVar11 = vpcmpub_avx512vl(auVar37,auVar69,2);
          uVar1 = *(undefined4 *)(uVar24 + 0x38 + lVar20);
          auVar57._4_4_ = uVar1;
          auVar57._0_4_ = uVar1;
          auVar57._8_4_ = uVar1;
          auVar57._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar24 + 0x44 + lVar20);
          auVar70._4_4_ = uVar1;
          auVar70._0_4_ = uVar1;
          auVar70._8_4_ = uVar1;
          auVar70._12_4_ = uVar1;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)(local_ae0 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar78);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar38 = vfmadd213ps_fma(auVar37,auVar70,auVar57);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(local_ae8 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar87);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar39 = vfmadd213ps_fma(auVar37,auVar70,auVar57);
          uVar1 = *(undefined4 *)(uVar24 + 0x3c + lVar20);
          auVar58._4_4_ = uVar1;
          auVar58._0_4_ = uVar1;
          auVar58._8_4_ = uVar1;
          auVar58._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar24 + 0x48 + lVar20);
          auVar71._4_4_ = uVar1;
          auVar71._0_4_ = uVar1;
          auVar71._8_4_ = uVar1;
          auVar71._12_4_ = uVar1;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)(local_af0 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar88);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar40 = vfmadd213ps_fma(auVar37,auVar71,auVar58);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)(local_af8 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar89);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar86 = vfmadd213ps_fma(auVar37,auVar71,auVar58);
          uVar1 = *(undefined4 *)(uVar24 + 0x40 + lVar20);
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar24 + 0x4c + lVar20);
          auVar72._4_4_ = uVar1;
          auVar72._0_4_ = uVar1;
          auVar72._8_4_ = uVar1;
          auVar72._12_4_ = uVar1;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)(local_b00 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar90);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar57 = vfmadd213ps_fma(auVar37,auVar72,auVar59);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)(local_b08 + 0x20 + local_ac8);
          auVar37 = vpmovzxbd_avx(auVar91);
          auVar37 = vcvtdq2ps_avx(auVar37);
          auVar58 = vfmadd213ps_fma(auVar37,auVar72,auVar59);
          auVar37 = vfmadd213ps_avx512vl(auVar38,auVar102._0_16_,auVar105._0_16_);
          auVar38 = vfmadd213ps_avx512vl(auVar40,auVar103._0_16_,auVar106._0_16_);
          auVar37 = vpmaxsd_avx(auVar37,auVar38);
          auVar40 = vfmadd213ps_avx512vl(auVar57,auVar104._0_16_,auVar107._0_16_);
          auVar38 = vfmadd213ps_avx512vl(auVar39,auVar102._0_16_,auVar105._0_16_);
          auVar39 = vfmadd213ps_avx512vl(auVar86,auVar103._0_16_,auVar106._0_16_);
          auVar38 = vpminsd_avx(auVar38,auVar39);
          auVar39 = vfmadd213ps_avx512vl(auVar58,auVar104._0_16_,auVar107._0_16_);
          auVar40 = vpmaxsd_avx512vl(auVar40,auVar108._0_16_);
          auVar37 = vpmaxsd_avx(auVar37,auVar40);
          auVar39 = vpminsd_avx512vl(auVar39,auVar109._0_16_);
          auVar38 = vpminsd_avx(auVar38,auVar39);
          uVar26 = vpcmpd_avx512vl(auVar37,auVar38,2);
          uVar26 = ((byte)uVar11 & 0xf) & uVar26;
          if ((char)uVar26 != '\0') {
            do {
              lVar20 = 0;
              for (uVar27 = uVar26; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              pGVar3 = (context->scene->geometries).items[*(uint *)(local_ac8 + 0x50)].ptr;
              lVar4 = *(long *)&pGVar3->field_0x58;
              lVar5 = *(long *)&pGVar3[1].time_range.upper;
              lVar25 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)*(uint *)(local_ac8 + 4 + lVar20 * 8);
              uVar27 = *(ulong *)(local_ac8 + lVar20 * 8);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar27;
              auVar37 = vpandq_avx512vl(auVar60,auVar110._0_16_);
              auVar57 = vpmovzxwd_avx(auVar37);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(lVar4 + lVar25);
              auVar37 = vpaddd_avx(auVar73,auVar57);
              auVar38 = vpmulld_avx(auVar73,auVar57);
              auVar38 = vpsrlq_avx(auVar38,0x20);
              auVar37 = vpaddd_avx(auVar37,auVar38);
              lVar32 = CONCAT44((int)((ulong)puVar33 >> 0x20),auVar37._0_4_);
              p_Var6 = pGVar3[1].intersectionFilterN;
              auVar37 = *(undefined1 (*) [16])(lVar5 + (lVar32 + 1) * (long)p_Var6);
              uVar29 = *(ulong *)(lVar4 + lVar25) >> 0x20;
              lVar31 = uVar29 + lVar32 + 1;
              auVar38 = *(undefined1 (*) [16])(lVar5 + (uVar29 + lVar32) * (long)p_Var6);
              auVar39 = *(undefined1 (*) [16])(lVar5 + lVar31 * (long)p_Var6);
              uVar28 = (ulong)(-1 < (short)uVar27);
              auVar40 = *(undefined1 (*) [16])(lVar5 + (lVar32 + uVar28 + 1) * (long)p_Var6);
              lVar20 = uVar28 + lVar31;
              puVar33 = (ulong *)(lVar20 * (long)p_Var6);
              auVar86 = *(undefined1 (*) [16])(lVar5 + (long)puVar33);
              uVar28 = 0;
              if (-1 < (short)(uVar27 >> 0x10)) {
                uVar28 = uVar29;
              }
              auVar58 = *(undefined1 (*) [16])(lVar5 + (uVar29 + lVar32 + uVar28) * (long)p_Var6);
              auVar59 = *(undefined1 (*) [16])(lVar5 + (lVar31 + uVar28) * (long)p_Var6);
              auVar48._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar28 + lVar20) * (long)p_Var6);
              auVar48._0_16_ = auVar39;
              auVar70 = vunpcklps_avx(auVar37,auVar86);
              auVar69 = vunpckhps_avx(auVar37,auVar86);
              auVar71 = vunpcklps_avx(auVar40,auVar39);
              auVar40 = vunpckhps_avx(auVar40,auVar39);
              auVar72 = vunpcklps_avx(auVar69,auVar40);
              auVar78 = vunpcklps_avx(auVar70,auVar71);
              auVar40 = vunpckhps_avx(auVar70,auVar71);
              auVar70 = vunpcklps_avx(auVar38,auVar59);
              auVar69 = vunpckhps_avx(auVar38,auVar59);
              auVar71 = vunpcklps_avx(auVar39,auVar58);
              auVar58 = vunpckhps_avx(auVar39,auVar58);
              auVar69 = vunpcklps_avx(auVar69,auVar58);
              auVar87 = vunpcklps_avx(auVar70,auVar71);
              auVar58 = vunpckhps_avx(auVar70,auVar71);
              auVar52._16_16_ = auVar59;
              auVar52._0_16_ = auVar38;
              auVar53._16_16_ = auVar86;
              auVar53._0_16_ = auVar37;
              auVar42 = vunpcklps_avx(auVar53,auVar52);
              auVar54._16_16_ = auVar39;
              auVar54._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar32);
              auVar55 = vunpcklps_avx(auVar54,auVar48);
              auVar46 = vunpcklps_avx(auVar55,auVar42);
              auVar47 = vunpckhps_avx(auVar55,auVar42);
              auVar42 = vunpckhps_avx(auVar53,auVar52);
              auVar55 = vunpckhps_avx(auVar54,auVar48);
              auVar48 = vunpcklps_avx(auVar55,auVar42);
              auVar42._16_16_ = auVar78;
              auVar42._0_16_ = auVar78;
              auVar55._16_16_ = auVar40;
              auVar55._0_16_ = auVar40;
              auVar51._16_16_ = auVar72;
              auVar51._0_16_ = auVar72;
              auVar50._16_16_ = auVar87;
              auVar50._0_16_ = auVar87;
              auVar94._16_16_ = auVar58;
              auVar94._0_16_ = auVar58;
              auVar92._16_16_ = auVar69;
              auVar92._0_16_ = auVar69;
              auVar42 = vsubps_avx(auVar46,auVar42);
              auVar55 = vsubps_avx(auVar47,auVar55);
              auVar54 = vsubps_avx(auVar48,auVar51);
              auVar53 = vsubps_avx(auVar50,auVar46);
              auVar52 = vsubps_avx(auVar94,auVar47);
              auVar51 = vsubps_avx(auVar92,auVar48);
              auVar43._4_4_ = auVar55._4_4_ * auVar51._4_4_;
              auVar43._0_4_ = auVar55._0_4_ * auVar51._0_4_;
              auVar43._8_4_ = auVar55._8_4_ * auVar51._8_4_;
              auVar43._12_4_ = auVar55._12_4_ * auVar51._12_4_;
              auVar43._16_4_ = auVar55._16_4_ * auVar51._16_4_;
              auVar43._20_4_ = auVar55._20_4_ * auVar51._20_4_;
              auVar43._24_4_ = auVar55._24_4_ * auVar51._24_4_;
              auVar43._28_4_ = auVar78._12_4_;
              auVar37 = vfmsub231ps_fma(auVar43,auVar52,auVar54);
              auVar44._4_4_ = auVar54._4_4_ * auVar53._4_4_;
              auVar44._0_4_ = auVar54._0_4_ * auVar53._0_4_;
              auVar44._8_4_ = auVar54._8_4_ * auVar53._8_4_;
              auVar44._12_4_ = auVar54._12_4_ * auVar53._12_4_;
              auVar44._16_4_ = auVar54._16_4_ * auVar53._16_4_;
              auVar44._20_4_ = auVar54._20_4_ * auVar53._20_4_;
              auVar44._24_4_ = auVar54._24_4_ * auVar53._24_4_;
              auVar44._28_4_ = auVar40._12_4_;
              auVar38 = vfmsub231ps_fma(auVar44,auVar51,auVar42);
              auVar49._4_4_ = auVar42._4_4_ * auVar52._4_4_;
              auVar49._0_4_ = auVar42._0_4_ * auVar52._0_4_;
              auVar49._8_4_ = auVar42._8_4_ * auVar52._8_4_;
              auVar49._12_4_ = auVar42._12_4_ * auVar52._12_4_;
              auVar49._16_4_ = auVar42._16_4_ * auVar52._16_4_;
              auVar49._20_4_ = auVar42._20_4_ * auVar52._20_4_;
              auVar49._24_4_ = auVar42._24_4_ * auVar52._24_4_;
              auVar49._28_4_ = auVar72._12_4_;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar95._4_4_ = uVar1;
              auVar95._0_4_ = uVar1;
              auVar95._8_4_ = uVar1;
              auVar95._12_4_ = uVar1;
              auVar95._16_4_ = uVar1;
              auVar95._20_4_ = uVar1;
              auVar95._24_4_ = uVar1;
              auVar95._28_4_ = uVar1;
              auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
              auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
              uVar1 = *(undefined4 *)(ray + k * 4);
              auVar45._4_4_ = uVar1;
              auVar45._0_4_ = uVar1;
              auVar45._8_4_ = uVar1;
              auVar45._12_4_ = uVar1;
              auVar45._16_4_ = uVar1;
              auVar45._20_4_ = uVar1;
              auVar45._24_4_ = uVar1;
              auVar45._28_4_ = uVar1;
              auVar45 = vsubps_avx512vl(auVar46,auVar45);
              auVar39 = vfmsub231ps_fma(auVar49,auVar53,auVar55);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar46._4_4_ = uVar1;
              auVar46._0_4_ = uVar1;
              auVar46._8_4_ = uVar1;
              auVar46._12_4_ = uVar1;
              auVar46._16_4_ = uVar1;
              auVar46._20_4_ = uVar1;
              auVar46._24_4_ = uVar1;
              auVar46._28_4_ = uVar1;
              auVar46 = vsubps_avx512vl(auVar47,auVar46);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar47._4_4_ = uVar1;
              auVar47._0_4_ = uVar1;
              auVar47._8_4_ = uVar1;
              auVar47._12_4_ = uVar1;
              auVar47._16_4_ = uVar1;
              auVar47._20_4_ = uVar1;
              auVar47._24_4_ = uVar1;
              auVar47._28_4_ = uVar1;
              auVar47 = vsubps_avx512vl(auVar48,auVar47);
              auVar48 = vmulps_avx512vl(auVar43,auVar47);
              auVar48 = vfmsub231ps_avx512vl(auVar48,auVar46,auVar44);
              auVar49 = vmulps_avx512vl(auVar44,auVar45);
              auVar49 = vfmsub231ps_avx512vl(auVar49,auVar47,auVar95);
              auVar50 = vmulps_avx512vl(auVar95,auVar46);
              auVar50 = vfmsub231ps_avx512vl(auVar50,auVar45,auVar43);
              auVar44 = vmulps_avx512vl(ZEXT1632(auVar39),auVar44);
              auVar43 = vfmadd231ps_avx512vl(auVar44,ZEXT1632(auVar38),auVar43);
              local_900 = vfmadd231ps_avx512vl(auVar43,ZEXT1632(auVar37),auVar95);
              vandps_avx512vl(local_900,auVar111._0_32_);
              vandps_avx512vl(local_900,auVar112._0_32_);
              auVar51 = vmulps_avx512vl(auVar51,auVar50);
              auVar52 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar52);
              auVar53 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar53);
              fVar77 = local_900._0_4_;
              auVar93._0_4_ = (float)((uint)fVar77 ^ auVar53._0_4_);
              fVar80 = local_900._4_4_;
              auVar93._4_4_ = (float)((uint)fVar80 ^ auVar53._4_4_);
              fVar81 = local_900._8_4_;
              auVar93._8_4_ = (float)((uint)fVar81 ^ auVar53._8_4_);
              fVar82 = local_900._12_4_;
              auVar93._12_4_ = (float)((uint)fVar82 ^ auVar53._12_4_);
              fVar96 = local_900._16_4_;
              auVar93._16_4_ = (float)((uint)fVar96 ^ auVar53._16_4_);
              fVar97 = local_900._20_4_;
              auVar93._20_4_ = (float)((uint)fVar97 ^ auVar53._20_4_);
              fVar98 = local_900._24_4_;
              auVar93._24_4_ = (float)((uint)fVar98 ^ auVar53._24_4_);
              uVar99 = local_900._28_4_;
              auVar93._28_4_ = (float)(uVar99 ^ auVar53._28_4_);
              auVar54 = vmulps_avx512vl(auVar54,auVar50);
              auVar55 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar49);
              auVar42 = vfmadd231ps_avx512vl(auVar55,auVar42,auVar48);
              auVar100._0_4_ = (float)((uint)fVar77 ^ auVar42._0_4_);
              auVar100._4_4_ = (float)((uint)fVar80 ^ auVar42._4_4_);
              auVar100._8_4_ = (float)((uint)fVar81 ^ auVar42._8_4_);
              auVar100._12_4_ = (float)((uint)fVar82 ^ auVar42._12_4_);
              auVar100._16_4_ = (float)((uint)fVar96 ^ auVar42._16_4_);
              auVar100._20_4_ = (float)((uint)fVar97 ^ auVar42._20_4_);
              auVar100._24_4_ = (float)((uint)fVar98 ^ auVar42._24_4_);
              auVar100._28_4_ = (float)(uVar99 ^ auVar42._28_4_);
              uVar11 = vcmpps_avx512vl(auVar93,ZEXT832(0) << 0x20,5);
              uVar8 = vcmpps_avx512vl(auVar100,ZEXT832(0) << 0x20,5);
              uVar9 = vcmpps_avx512vl(local_900,ZEXT832(0) << 0x20,4);
              auVar101._0_4_ = auVar93._0_4_ + auVar100._0_4_;
              auVar101._4_4_ = auVar93._4_4_ + auVar100._4_4_;
              auVar101._8_4_ = auVar93._8_4_ + auVar100._8_4_;
              auVar101._12_4_ = auVar93._12_4_ + auVar100._12_4_;
              auVar101._16_4_ = auVar93._16_4_ + auVar100._16_4_;
              auVar101._20_4_ = auVar93._20_4_ + auVar100._20_4_;
              auVar101._24_4_ = auVar93._24_4_ + auVar100._24_4_;
              auVar101._28_4_ = auVar93._28_4_ + auVar100._28_4_;
              uVar10 = vcmpps_avx512vl(auVar101,local_900,2);
              local_8df = (byte)uVar11 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
              if (local_8df != 0) {
                auVar16._4_4_ = auVar39._4_4_ * auVar47._4_4_;
                auVar16._0_4_ = auVar39._0_4_ * auVar47._0_4_;
                auVar16._8_4_ = auVar39._8_4_ * auVar47._8_4_;
                auVar16._12_4_ = auVar39._12_4_ * auVar47._12_4_;
                auVar16._16_4_ = auVar47._16_4_ * 0.0;
                auVar16._20_4_ = auVar47._20_4_ * 0.0;
                auVar16._24_4_ = auVar47._24_4_ * 0.0;
                auVar16._28_4_ = auVar47._28_4_;
                auVar40 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar38),auVar16);
                auVar40 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar37),ZEXT1632(auVar40));
                local_920._0_4_ = (float)((uint)fVar77 ^ auVar40._0_4_);
                local_920._4_4_ = (float)((uint)fVar80 ^ auVar40._4_4_);
                local_920._8_4_ = (float)((uint)fVar81 ^ auVar40._8_4_);
                local_920._12_4_ = (float)((uint)fVar82 ^ auVar40._12_4_);
                local_920._16_4_ = fVar96;
                local_920._20_4_ = fVar97;
                local_920._24_4_ = fVar98;
                local_920._28_4_ = uVar99;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
                auVar13._4_4_ = uVar1;
                auVar13._0_4_ = uVar1;
                auVar13._8_4_ = uVar1;
                auVar13._12_4_ = uVar1;
                auVar13._16_4_ = uVar1;
                auVar13._20_4_ = uVar1;
                auVar13._24_4_ = uVar1;
                auVar13._28_4_ = uVar1;
                auVar42 = vmulps_avx512vl(local_900,auVar13);
                uVar11 = vcmpps_avx512vl(auVar42,local_920,1);
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar14._4_4_ = uVar1;
                auVar14._0_4_ = uVar1;
                auVar14._8_4_ = uVar1;
                auVar14._12_4_ = uVar1;
                auVar14._16_4_ = uVar1;
                auVar14._20_4_ = uVar1;
                auVar14._24_4_ = uVar1;
                auVar14._28_4_ = uVar1;
                auVar42 = vmulps_avx512vl(local_900,auVar14);
                uVar8 = vcmpps_avx512vl(local_920,auVar42,2);
                local_8df = (byte)uVar11 & (byte)uVar8 & local_8df;
                if (local_8df != 0) {
                  auVar42 = vsubps_avx(local_900,auVar100);
                  auVar42 = vblendps_avx(auVar93,auVar42,0xf0);
                  auVar55 = vsubps_avx(local_900,auVar93);
                  auVar55 = vblendps_avx(auVar100,auVar55,0xf0);
                  local_860._0_4_ = auVar37._0_4_ * 1.0;
                  local_860._4_4_ = auVar37._4_4_ * 1.0;
                  local_860._8_4_ = auVar37._8_4_ * 1.0;
                  local_860._12_4_ = auVar37._12_4_ * 1.0;
                  local_860._16_4_ = 0x80000000;
                  local_860._20_4_ = 0x80000000;
                  local_860._24_4_ = 0x80000000;
                  local_860._28_4_ = 0;
                  local_840._4_4_ = auVar38._4_4_ * 1.0;
                  local_840._0_4_ = auVar38._0_4_ * 1.0;
                  local_840._8_4_ = auVar38._8_4_ * 1.0;
                  local_840._12_4_ = auVar38._12_4_ * 1.0;
                  local_840._16_4_ = 0x80000000;
                  local_840._20_4_ = 0x80000000;
                  local_840._24_4_ = 0x80000000;
                  local_840._28_4_ = 0;
                  local_820._4_4_ = auVar39._4_4_ * 1.0;
                  local_820._0_4_ = auVar39._0_4_ * 1.0;
                  local_820._8_4_ = auVar39._8_4_ * 1.0;
                  local_820._12_4_ = auVar39._12_4_ * 1.0;
                  local_820._16_4_ = 0x80000000;
                  local_820._20_4_ = 0x80000000;
                  local_820._24_4_ = 0x80000000;
                  local_820._28_4_ = 0;
                  auVar79._8_4_ = 1;
                  auVar79._0_8_ = 0x100000001;
                  auVar79._12_4_ = 1;
                  auVar79._16_4_ = 1;
                  auVar79._20_4_ = 1;
                  auVar79._24_4_ = 1;
                  auVar79._28_4_ = 1;
                  auVar54 = vpermd_avx2(auVar79,ZEXT1632(auVar57));
                  auVar53 = vpaddd_avx2(auVar54,_DAT_0205d4e0);
                  auVar61._0_4_ = auVar57._0_4_;
                  auVar61._4_4_ = auVar61._0_4_;
                  auVar61._8_4_ = auVar61._0_4_;
                  auVar61._12_4_ = auVar61._0_4_;
                  auVar61._16_4_ = auVar61._0_4_;
                  auVar61._20_4_ = auVar61._0_4_;
                  auVar61._24_4_ = auVar61._0_4_;
                  auVar61._28_4_ = auVar61._0_4_;
                  local_a50 = auVar102._0_16_;
                  auVar37 = vcvtsi2ss_avx512f(local_a50,*(ushort *)(lVar4 + 8 + lVar25) - 1);
                  auVar54 = vpaddd_avx2(auVar61,_DAT_0205d4c0);
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = ZEXT812(0);
                  auVar38 = vrcp14ss_avx512f(auVar17 << 0x20,ZEXT416(auVar37._0_4_));
                  auVar37 = vfnmadd213ss_fma(auVar37,auVar38,SUB6416(ZEXT464(0x40000000),0));
                  fVar67 = auVar38._0_4_ * auVar37._0_4_;
                  auVar37 = vcvtsi2ss_avx512f(local_a50,*(ushort *)(lVar4 + 10 + lVar25) - 1);
                  auVar38 = vrcp14ss_avx512f(auVar17 << 0x20,ZEXT416(auVar37._0_4_));
                  auVar37 = vfnmadd213ss_fma(auVar37,auVar38,SUB6416(ZEXT464(0x40000000),0));
                  fVar85 = auVar38._0_4_ * auVar37._0_4_;
                  auVar54 = vcvtdq2ps_avx(auVar54);
                  fStack_8a4 = auVar54._28_4_ + auVar42._28_4_;
                  fVar56 = (fVar77 * auVar54._0_4_ + auVar42._0_4_) * fVar67;
                  fVar62 = (fVar80 * auVar54._4_4_ + auVar42._4_4_) * fVar67;
                  local_960._4_4_ = fVar62;
                  local_960._0_4_ = fVar56;
                  fVar63 = (fVar81 * auVar54._8_4_ + auVar42._8_4_) * fVar67;
                  local_960._8_4_ = fVar63;
                  fVar64 = (fVar82 * auVar54._12_4_ + auVar42._12_4_) * fVar67;
                  local_960._12_4_ = fVar64;
                  fVar65 = (fVar96 * auVar54._16_4_ + auVar42._16_4_) * fVar67;
                  local_960._16_4_ = fVar65;
                  fVar66 = (fVar97 * auVar54._20_4_ + auVar42._20_4_) * fVar67;
                  local_960._20_4_ = fVar66;
                  fVar67 = (fVar98 * auVar54._24_4_ + auVar42._24_4_) * fVar67;
                  local_960._24_4_ = fVar67;
                  local_960._28_4_ = fStack_8a4;
                  auVar42 = vcvtdq2ps_avx(auVar53);
                  fVar77 = (fVar77 * auVar42._0_4_ + auVar55._0_4_) * fVar85;
                  fVar80 = (fVar80 * auVar42._4_4_ + auVar55._4_4_) * fVar85;
                  local_940._4_4_ = fVar80;
                  local_940._0_4_ = fVar77;
                  fVar81 = (fVar81 * auVar42._8_4_ + auVar55._8_4_) * fVar85;
                  local_940._8_4_ = fVar81;
                  fVar82 = (fVar82 * auVar42._12_4_ + auVar55._12_4_) * fVar85;
                  local_940._12_4_ = fVar82;
                  fVar83 = (fVar96 * auVar42._16_4_ + auVar55._16_4_) * fVar85;
                  local_940._16_4_ = fVar83;
                  fVar84 = (fVar97 * auVar42._20_4_ + auVar55._20_4_) * fVar85;
                  local_940._20_4_ = fVar84;
                  fVar85 = (fVar98 * auVar42._24_4_ + auVar55._24_4_) * fVar85;
                  local_940._24_4_ = fVar85;
                  local_940._28_4_ = auVar42._28_4_ + auVar55._28_4_;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00796cbe;
                    auVar42 = vrcp14ps_avx512vl(local_900);
                    auVar15._8_4_ = 0x3f800000;
                    auVar15._0_8_ = &DAT_3f8000003f800000;
                    auVar15._12_4_ = 0x3f800000;
                    auVar15._16_4_ = 0x3f800000;
                    auVar15._20_4_ = 0x3f800000;
                    auVar15._24_4_ = 0x3f800000;
                    auVar15._28_4_ = 0x3f800000;
                    auVar55 = vfnmadd213ps_avx512vl(local_900,auVar42,auVar15);
                    auVar37 = vfmadd132ps_fma(auVar55,auVar42,auVar42);
                    fVar68 = auVar37._0_4_;
                    fVar74 = auVar37._4_4_;
                    local_880._4_4_ = fVar74 * local_920._4_4_;
                    local_880._0_4_ = fVar68 * local_920._0_4_;
                    fVar75 = auVar37._8_4_;
                    local_880._8_4_ = fVar75 * local_920._8_4_;
                    fVar76 = auVar37._12_4_;
                    local_880._12_4_ = fVar76 * local_920._12_4_;
                    local_880._16_4_ = fVar96 * 0.0;
                    local_880._20_4_ = fVar97 * 0.0;
                    local_880._24_4_ = fVar98 * 0.0;
                    local_880._28_4_ = auVar42._28_4_;
                    local_8c0[0] = fVar56 * fVar68;
                    local_8c0[1] = fVar62 * fVar74;
                    local_8c0[2] = fVar63 * fVar75;
                    local_8c0[3] = fVar64 * fVar76;
                    fStack_8b0 = fVar65 * 0.0;
                    fStack_8ac = fVar66 * 0.0;
                    fStack_8a8 = fVar67 * 0.0;
                    local_8a0._4_4_ = fVar80 * fVar74;
                    local_8a0._0_4_ = fVar77 * fVar68;
                    local_8a0._8_4_ = fVar81 * fVar75;
                    local_8a0._12_4_ = fVar82 * fVar76;
                    local_8a0._16_4_ = fVar83 * 0.0;
                    local_8a0._20_4_ = fVar84 * 0.0;
                    local_8a0._24_4_ = fVar85 * 0.0;
                    local_8a0._28_4_ = fStack_8a4;
                    puVar33 = (ulong *)(ulong)local_8df;
                    bVar36 = puVar33 == (ulong *)0x0;
                    if (!bVar36) {
                      local_b78 = 0;
                      for (puVar12 = puVar33; ((ulong)puVar12 & 1) == 0;
                          puVar12 = (ulong *)((ulong)puVar12 >> 1 | 0x8000000000000000)) {
                        local_b78 = local_b78 + 1;
                      }
                      local_a10 = vpbroadcastd_avx512vl();
                      auVar37 = vpbroadcastd_avx512vl();
                      local_a60 = auVar103._0_16_;
                      local_a70 = auVar104._0_16_;
                      local_a80 = auVar105._0_16_;
                      local_a90 = auVar106._0_16_;
                      local_aa0 = auVar107._0_16_;
                      local_ab0 = vmovdqa64_avx512vl(auVar108._0_16_);
                      local_ac0 = vmovdqa64_avx512vl(auVar109._0_16_);
                      do {
                        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                        fVar77 = local_8c0[local_b78];
                        local_9c0._4_4_ = fVar77;
                        local_9c0._0_4_ = fVar77;
                        local_9c0._8_4_ = fVar77;
                        local_9c0._12_4_ = fVar77;
                        uVar2 = *(undefined4 *)(local_8a0 + local_b78 * 4);
                        local_9b0._4_4_ = uVar2;
                        local_9b0._0_4_ = uVar2;
                        local_9b0._8_4_ = uVar2;
                        local_9b0._12_4_ = uVar2;
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_880 + local_b78 * 4);
                        local_a40.context = context->user;
                        local_9f0 = *(undefined4 *)(local_860 + local_b78 * 4);
                        uVar2 = *(undefined4 *)(local_840 + local_b78 * 4);
                        local_9e0._4_4_ = uVar2;
                        local_9e0._0_4_ = uVar2;
                        local_9e0._8_4_ = uVar2;
                        local_9e0._12_4_ = uVar2;
                        local_9d0 = *(undefined4 *)(local_820 + local_b78 * 4);
                        local_b60 = auVar37._0_8_;
                        uStack_b58 = auVar37._8_8_;
                        local_9a0 = local_b60;
                        uStack_998 = uStack_b58;
                        local_990 = local_a10;
                        vpcmpeqd_avx2(ZEXT1632(local_a10),ZEXT1632(local_a10));
                        uStack_97c = (local_a40.context)->instID[0];
                        local_980 = uStack_97c;
                        uStack_978 = uStack_97c;
                        uStack_974 = uStack_97c;
                        uStack_970 = (local_a40.context)->instPrimID[0];
                        uStack_96c = uStack_970;
                        uStack_968 = uStack_970;
                        uStack_964 = uStack_970;
                        local_b50 = local_a00._0_8_;
                        uStack_b48 = local_a00._8_8_;
                        local_a40.valid = (int *)&local_b50;
                        local_a40.geometryUserPtr = pGVar3->userPtr;
                        local_a40.hit = (RTCHitN *)&local_9f0;
                        local_a40.N = 4;
                        local_a40.ray = (RTCRayN *)ray;
                        uStack_9ec = local_9f0;
                        uStack_9e8 = local_9f0;
                        uStack_9e4 = local_9f0;
                        uStack_9cc = local_9d0;
                        uStack_9c8 = local_9d0;
                        uStack_9c4 = local_9d0;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_a40);
                        }
                        auVar18._8_8_ = uStack_b48;
                        auVar18._0_8_ = local_b50;
                        uVar27 = vptestmd_avx512vl(auVar18,auVar18);
                        if ((uVar27 & 0xf) != 0) {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_a40);
                          }
                          auVar19._8_8_ = uStack_b48;
                          auVar19._0_8_ = local_b50;
                          uVar27 = vptestmd_avx512vl(auVar19,auVar19);
                          uVar27 = uVar27 & 0xf;
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar7 = (bool)((byte)uVar27 & 1);
                          auVar41._0_4_ =
                               (uint)bVar7 * auVar38._0_4_ |
                               (uint)!bVar7 * *(int *)(local_a40.ray + 0x80);
                          bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
                          auVar41._4_4_ =
                               (uint)bVar7 * auVar38._4_4_ |
                               (uint)!bVar7 * *(int *)(local_a40.ray + 0x84);
                          bVar7 = (bool)((byte)(uVar27 >> 2) & 1);
                          auVar41._8_4_ =
                               (uint)bVar7 * auVar38._8_4_ |
                               (uint)!bVar7 * *(int *)(local_a40.ray + 0x88);
                          bVar7 = SUB81(uVar27 >> 3,0);
                          auVar41._12_4_ =
                               (uint)bVar7 * auVar38._12_4_ |
                               (uint)!bVar7 * *(int *)(local_a40.ray + 0x8c);
                          *(undefined1 (*) [16])(local_a40.ray + 0x80) = auVar41;
                          if ((byte)uVar27 != 0) {
                            auVar102 = ZEXT1664(local_a50);
                            auVar103 = ZEXT1664(local_a60);
                            auVar104 = ZEXT1664(local_a70);
                            auVar105 = ZEXT1664(local_a80);
                            auVar106 = ZEXT1664(local_a90);
                            auVar107 = ZEXT1664(local_aa0);
                            auVar37 = vmovdqa64_avx512vl(local_ab0);
                            auVar108 = ZEXT1664(auVar37);
                            auVar37 = vmovdqa64_avx512vl(local_ac0);
                            auVar109 = ZEXT1664(auVar37);
                            auVar37 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                            auVar110 = ZEXT1664(auVar37);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar111 = ZEXT3264(auVar42);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar112 = ZEXT3264(auVar42);
                            if (!bVar36) goto LAB_00796cbe;
                            break;
                          }
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                        uVar27 = local_b78 & 0x3f;
                        local_b78 = 0;
                        puVar33 = (ulong *)((ulong)puVar33 ^ 1L << uVar27);
                        for (puVar12 = puVar33; ((ulong)puVar12 & 1) == 0;
                            puVar12 = (ulong *)((ulong)puVar12 >> 1 | 0x8000000000000000)) {
                          local_b78 = local_b78 + 1;
                        }
                        bVar36 = puVar33 == (ulong *)0x0;
                        auVar102 = ZEXT1664(local_a50);
                        auVar103 = ZEXT1664(local_a60);
                        auVar104 = ZEXT1664(local_a70);
                        auVar105 = ZEXT1664(local_a80);
                        auVar106 = ZEXT1664(local_a90);
                        auVar107 = ZEXT1664(local_aa0);
                        auVar38 = vmovdqa64_avx512vl(local_ab0);
                        auVar108 = ZEXT1664(auVar38);
                        auVar38 = vmovdqa64_avx512vl(local_ac0);
                        auVar109 = ZEXT1664(auVar38);
                        auVar38 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                        auVar110 = ZEXT1664(auVar38);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar111 = ZEXT3264(auVar42);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar112 = ZEXT3264(auVar42);
                      } while (!bVar36);
                    }
                  }
                }
              }
              uVar26 = uVar26 - 1 & uVar26;
            } while (uVar26 != 0);
          }
          local_ad0 = local_ad0 + 1;
          bVar35 = local_ad0 < local_ad8;
        } while (local_ad0 != local_ad8);
      }
LAB_00796cbe:
      uVar99 = 0;
      uVar26 = local_b18;
      uVar27 = local_b20;
      uVar28 = local_b28;
      uVar29 = local_b30;
      uVar30 = local_b38;
      uVar34 = local_b40;
      if (bVar35) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar99 = 1;
      }
    }
    puVar33 = local_b88;
  } while ((uVar99 & 3) == 0);
  return puVar22 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }